

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexagons.cpp
# Opt level: O3

void drawHexagons(Mat *image,int factor)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Point local_c8;
  ulong local_c0;
  Scalar local_b8;
  Mat local_90 [96];
  
  if (-0x1c2 < factor) {
    uVar2 = factor * -3;
    iVar3 = factor * -2;
    local_c0 = (ulong)(uint)(factor << 2);
    uVar1 = 0;
    do {
      for (; (int)uVar2 < 0x5a1; uVar2 = uVar2 + factor * 6) {
        cv::Mat::Mat(local_90,image);
        local_b8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 255.0;
        local_b8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 255.0;
        local_b8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 255.0;
        local_b8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
        local_c8.x = uVar2;
        local_c8.y = iVar3;
        drawHexagon(local_90,&local_c8,&local_b8);
        cv::Mat::~Mat(local_90);
      }
      iVar3 = iVar3 + (int)local_c0;
      uVar2 = -(uVar1 & 1) & factor * 3;
      uVar1 = uVar1 + 1;
    } while (iVar3 < 900);
  }
  return;
}

Assistant:

void drawHexagons(Mat image, int factor) {
  // change x, y, factor values to increase/decrease distance between hexagons
  int x = 3;
  int y = 2;
  Point s(-x * factor, -y * factor);

  for(int row = 0; s.y < h; row++) {
    for(int col = 0; s.x <= w; col++) {
      drawHexagon(image, s, Scalar(255, 255, 255));
      s.x += x * factor * 2;
    }
    s.y += y * factor * 2;
    s.x = row % 2 ? x * factor : 0;
  }
}